

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O0

bool __thiscall
density::
sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
::try_reentrant_emplace<int,int>
          (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
           *this,progress_guarantee i_progress_guarantee,int *i_construction_params)

{
  bool bVar1;
  reentrant_put_transaction<int> local_68;
  undefined1 local_48 [8];
  reentrant_put_transaction<int> tranasction;
  int *i_construction_params_local;
  progress_guarantee i_progress_guarantee_local;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  *this_local;
  
  tranasction.m_queue =
       (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
        *)i_construction_params;
  try_start_reentrant_emplace<int,int>(&local_68,this,i_progress_guarantee,i_construction_params);
  reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
            ((reentrant_put_transaction<int> *)local_48,&local_68);
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_68);
  bVar1 = density::sp_heter_queue::reentrant_put_transaction::operator_cast_to_bool
                    ((reentrant_put_transaction *)local_48);
  if (bVar1) {
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::reentrant_put_transaction<int>::commit((reentrant_put_transaction<int> *)local_48);
  }
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)local_48);
  return bVar1;
}

Assistant:

bool
          try_reentrant_emplace(progress_guarantee i_progress_guarantee, CONSTRUCTION_PARAMS &&... i_construction_params) noexcept(
            noexcept(
              std::declval<sp_heter_queue>().template try_start_reentrant_emplace<ELEMENT_TYPE>(
                i_progress_guarantee, std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...)))
        {
            auto tranasction = try_start_reentrant_emplace<ELEMENT_TYPE>(
              i_progress_guarantee, std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            if (!tranasction)
                return false;
            tranasction.commit();
            return true;
        }